

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int DisconnectPololux(POLOLU *pPololu)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  lVar2 = 0;
  while ((POLOLU *)addrsPololu[lVar2] != pPololu) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      return 1;
    }
  }
  iVar1 = CloseRS232Port(&pPololu->RS232Port);
  __s = "Pololu disconnection failed.";
  if (iVar1 == 0) {
    __s = "Pololu disconnected.";
  }
  puts(__s);
  if (iVar1 != 0) {
    return 1;
  }
  addrsPololu[lVar2] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int DisconnectPololux(POLOLU* pPololu)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectPololu(pPololu);
	if (res != EXIT_SUCCESS) return res;

	addrsPololu[id] = NULL;

	return EXIT_SUCCESS;
}